

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::C_formatter<spdlog::details::null_scoped_padder>::format
          (C_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  size_t sVar1;
  buffer<char> *buf;
  ulong uVar2;
  basic_string_view<char> fmt;
  uint local_68 [6];
  char *local_50;
  undefined8 local_48;
  undefined4 local_40;
  memory_buf_t *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined8 local_20;
  
  local_28 = (undefined1 *)local_68;
  local_68[0] = tm_time->tm_year % 100;
  if (local_68[0] < 100) {
    uVar2 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar2) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar2);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(local_68[0] / 10) | 0x30;
    uVar2 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar2) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar2);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] =
         (char)local_68[0] + (char)(local_68[0] / 10) * -10 | 0x30;
  }
  else {
    local_50 = "{:02}";
    local_48 = 5;
    local_40 = 0;
    local_30 = 1;
    local_20 = 0;
    fmt.size_ = (size_t)&local_50;
    fmt.data_ = (char *)0x5;
    local_38 = dest;
    ::fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)"{:02}",fmt,(format_handler<char> *)((ulong)(long)tm_time->tm_year >> 0x3f)
              );
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }